

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O2

void __thiscall TPZMatrix<Fad<float>_>::Print(TPZMatrix<Fad<float>_> *this,ostream *out)

{
  string name;
  allocator<char> local_39;
  undefined8 local_38 [4];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,
             "virtual void TPZMatrix<Fad<float>>::Print(std::ostream &) const [T = Fad<float>]",
             &local_39);
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1c])(this,local_38[0],out,0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

virtual void Print(std::ostream &out) const 
    {
        std::string name = __PRETTY_FUNCTION__;
        Print(name.c_str(),out);
    }